

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.h
# Opt level: O2

int __thiscall crnlib::cfile_stream::close(cfile_stream *this,int __fd)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  byte bVar3;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  bVar3 = bVar1 & 0xfd;
  (this->super_data_stream).field_0x1a = bVar3;
  if ((bVar1 & 1) != 0) {
    iVar2 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    if (this->m_has_ownership == true) {
      iVar2 = fclose((FILE *)this->m_pFile);
      iVar2 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 != -1);
      bVar3 = (this->super_data_stream).field_0x1a;
    }
    this->m_pFile = (FILE *)0x0;
    (this->super_data_stream).field_0x1a = bVar3 & 0xfe;
    this->m_size = 0;
    this->m_ofs = 0;
    this->m_has_ownership = false;
    return iVar2;
  }
  return 0;
}

Assistant:

inline void clear_error() { m_error = false; }